

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef fold_kfold_strref_snew(jit_State *J)

{
  IRRef1 IVar1;
  IRRef1 IVar2;
  IRIns *pIVar3;
  TRef TVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = 0;
  if (((J->fold).left[0].field_1.t.irt & 0x40) == 0) {
    if (((short)(J->fold).ins.field_0.op2 < 0) || ((J->fold).right[0].field_1.op12 != 0)) {
      pIVar3 = (J->cur).ir;
      uVar6 = (ulong)(J->fold).left[0].field_0.op1;
      uVar5 = 0;
      if ((*(char *)((long)pIVar3 + uVar6 * 8 + 5) == '@') &&
         ((*(byte *)((long)pIVar3 + uVar6 * 8 + 4) & 0x40) == 0)) {
        IVar1 = pIVar3[uVar6].field_0.op1;
        IVar2 = *(IRRef1 *)((long)pIVar3 + uVar6 * 8 + 2);
        (J->fold).ins.field_0.ot = 0x2913;
        (J->fold).ins.field_0.op1 = IVar2;
        TVar4 = lj_opt_fold(J);
        (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op1 = IVar1;
        (J->fold).ins.field_0.ot = 0x4009;
        uVar5 = 1;
      }
    }
    else {
      uVar5 = (uint)(J->fold).left[0].field_0.op1;
    }
  }
  return uVar5;
}

Assistant:

LJFOLD(STRREF SNEW any)
LJFOLDF(kfold_strref_snew)
{
  PHIBARRIER(fleft);
  if (irref_isk(fins->op2) && fright->i == 0) {
    return fleft->op1;  /* strref(snew(ptr, len), 0) ==> ptr */
  } else {
    /* Reassociate: strref(snew(strref(str, a), len), b) ==> strref(str, a+b) */
    IRIns *ir = IR(fleft->op1);
    if (ir->o == IR_STRREF) {
      IRRef1 str = ir->op1;  /* IRIns * is not valid across emitir. */
      PHIBARRIER(ir);
      fins->op2 = emitir(IRTI(IR_ADD), ir->op2, fins->op2); /* Clobbers fins! */
      fins->op1 = str;
      fins->ot = IRT(IR_STRREF, IRT_PGC);
      return RETRYFOLD;
    }
  }
  return NEXTFOLD;
}